

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::FramebufferVkImpl::FramebufferVkImpl
          (FramebufferVkImpl *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDevice,
          FramebufferDesc *Desc)

{
  uint uVar1;
  TextureViewVkImpl *this_00;
  VkImageView pVVar2;
  reference ppVVar3;
  VkFramebuffer_T *pVVar4;
  FramebufferWrapper local_c8;
  VulkanLogicalDevice *local_b0;
  VulkanLogicalDevice *LogicalDevice;
  ITextureView *pView;
  Uint32 i;
  vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> vkImgViews;
  RenderPassVkImpl *pRenderPassVkImpl;
  VkFramebufferCreateInfo FramebufferCI;
  FramebufferDesc *Desc_local;
  RenderDeviceVkImpl *pDevice_local;
  IReferenceCounters *pRefCounters_local;
  FramebufferVkImpl *this_local;
  
  FramebufferBase<Diligent::EngineVkImplTraits>::FramebufferBase
            (&this->super_FramebufferBase<Diligent::EngineVkImplTraits>,pRefCounters,pDevice,Desc,
             false);
  (this->super_FramebufferBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
  .super_ObjectBase<Diligent::IFramebufferVk>.super_RefCountedObject<Diligent::IFramebufferVk>.
  super_IFramebufferVk.super_IFramebuffer.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_013a2f18;
  VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>::
  VulkanObjectWrapper(&this->m_VkFramebuffer);
  FramebufferCI.pAttachments = (VkImageView *)0x0;
  FramebufferCI.width = 0;
  FramebufferCI.height = 0;
  FramebufferCI.renderPass = (VkRenderPass)0x0;
  FramebufferCI.attachmentCount = 0;
  FramebufferCI._36_4_ = 0;
  FramebufferCI.flags = 0;
  FramebufferCI._20_4_ = 0;
  pRenderPassVkImpl = (RenderPassVkImpl *)0x25;
  FramebufferCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  FramebufferCI._4_4_ = 0;
  FramebufferCI.pNext = (void *)0x0;
  vkImgViews.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)ClassPtrCast<Diligent::RenderPassVkImpl,Diligent::IRenderPass>
                          ((this->super_FramebufferBase<Diligent::EngineVkImplTraits>).
                           super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                           .m_Desc.pRenderPass);
  FramebufferCI._16_8_ =
       RenderPassVkImpl::GetVkRenderPass
                 ((RenderPassVkImpl *)
                  vkImgViews.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
  FramebufferCI.renderPass =
       (VkRenderPass)
       CONCAT44(FramebufferCI.renderPass._4_4_,
                (this->super_FramebufferBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                .m_Desc.AttachmentCount);
  uVar1 = (this->super_FramebufferBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
          .m_Desc.AttachmentCount;
  std::allocator<VkImageView_T_*>::allocator((allocator<VkImageView_T_*> *)((long)&pView + 7));
  std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::vector
            ((vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> *)&i,(ulong)uVar1,
             (allocator<VkImageView_T_*> *)((long)&pView + 7));
  std::allocator<VkImageView_T_*>::~allocator((allocator<VkImageView_T_*> *)((long)&pView + 7));
  for (pView._0_4_ = 0;
      (uint)pView <
      (this->super_FramebufferBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
      .m_Desc.AttachmentCount; pView._0_4_ = (uint)pView + 1) {
    LogicalDevice =
         (VulkanLogicalDevice *)
         (this->super_FramebufferBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
         .m_Desc.ppAttachments[(uint)pView];
    if (LogicalDevice != (VulkanLogicalDevice *)0x0) {
      this_00 = ClassPtrCast<Diligent::TextureViewVkImpl,Diligent::ITextureView>
                          ((ITextureView *)LogicalDevice);
      pVVar2 = TextureViewVkImpl::GetVulkanImageView(this_00);
      ppVVar3 = std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::operator[]
                          ((vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> *)&i,
                           (ulong)(uint)pView);
      *ppVVar3 = pVVar2;
    }
  }
  FramebufferCI._32_8_ =
       std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::data
                 ((vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> *)&i);
  FramebufferCI.pAttachments =
       *(VkImageView **)
        &(this->super_FramebufferBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
         .m_Desc.Width;
  FramebufferCI.width =
       (this->super_FramebufferBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
       .m_Desc.NumArraySlices;
  local_b0 = RenderDeviceVkImpl::GetLogicalDevice(pDevice);
  VulkanUtilities::VulkanLogicalDevice::CreateFramebuffer
            (&local_c8,local_b0,(VkFramebufferCreateInfo *)&pRenderPassVkImpl,
             (this->super_FramebufferBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>::
  operator=(&this->m_VkFramebuffer,&local_c8);
  VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>::
  ~VulkanObjectWrapper(&local_c8);
  pVVar4 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkFramebuffer_T_
                     ((VulkanObjectWrapper *)&this->m_VkFramebuffer);
  if (pVVar4 == (VkFramebuffer_T *)0x0) {
    LogError<true,char[36]>
              (false,"FramebufferVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FramebufferVkImpl.cpp"
               ,0x4e,(char (*) [36])"Failed to create Vulkan framebuffer");
  }
  std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::~vector
            ((vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> *)&i);
  return;
}

Assistant:

FramebufferVkImpl::FramebufferVkImpl(IReferenceCounters*    pRefCounters,
                                     RenderDeviceVkImpl*    pDevice,
                                     const FramebufferDesc& Desc) :
    TFramebufferBase{pRefCounters, pDevice, Desc}
{
    VkFramebufferCreateInfo FramebufferCI = {};

    FramebufferCI.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
    FramebufferCI.pNext = nullptr;
    FramebufferCI.flags = 0;

    auto* pRenderPassVkImpl  = ClassPtrCast<RenderPassVkImpl>(m_Desc.pRenderPass);
    FramebufferCI.renderPass = pRenderPassVkImpl->GetVkRenderPass();

    FramebufferCI.attachmentCount = m_Desc.AttachmentCount;

    std::vector<VkImageView> vkImgViews(m_Desc.AttachmentCount);
    for (Uint32 i = 0; i < m_Desc.AttachmentCount; ++i)
    {
        if (auto* pView = m_Desc.ppAttachments[i])
        {
            vkImgViews[i] = ClassPtrCast<TextureViewVkImpl>(pView)->GetVulkanImageView();
        }
    }
    FramebufferCI.pAttachments = vkImgViews.data();

    FramebufferCI.width  = m_Desc.Width;
    FramebufferCI.height = m_Desc.Height;
    FramebufferCI.layers = m_Desc.NumArraySlices;

    const auto& LogicalDevice = pDevice->GetLogicalDevice();

    m_VkFramebuffer = LogicalDevice.CreateFramebuffer(FramebufferCI, m_Desc.Name);
    if (!m_VkFramebuffer)
    {
        LOG_ERROR_AND_THROW("Failed to create Vulkan framebuffer");
    }
}